

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  uint uVar6;
  pointer pnVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  long lVar9;
  Real a;
  int iVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *v;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Item *pIVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar10 = *(x->super_IdxSet).idx;
  pnVar7 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_a8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar7[iVar10].m_backend.data + 0x20);
  local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[iVar10].m_backend.data;
  local_a8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar7[iVar10].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar7[iVar10].m_backend.data + 0x10);
  local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  iVar3 = pnVar7[iVar10].m_backend.exp;
  bVar2 = pnVar7[iVar10].m_backend.neg;
  fVar4 = pnVar7[iVar10].m_backend.fpclass;
  iVar5 = pnVar7[iVar10].m_backend.prec_elem;
  pIVar16 = (A->set).theitem + (A->set).thekey[iVar10].idx;
  local_a8.exp = iVar3;
  local_a8.neg = bVar2;
  local_a8.fpclass = fVar4;
  local_a8.prec_elem = iVar5;
  local_68.data._M_elems._0_8_ = local_a8.data._M_elems._0_8_;
  local_68.data._M_elems._8_8_ = local_a8.data._M_elems._8_8_;
  local_68.data._M_elems._16_8_ = local_a8.data._M_elems._16_8_;
  local_68.data._M_elems._24_8_ = local_a8.data._M_elems._24_8_;
  local_68.data._M_elems._32_8_ = local_a8.data._M_elems._32_8_;
  a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  local_68.neg = bVar2;
  if ((bVar2 == true) && (local_68.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_68.neg = false;
  }
  local_68.exp = iVar3;
  local_68.fpclass = fVar4;
  local_68.prec_elem = iVar5;
  if ((fVar4 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_e8,a);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_68,&local_e8);
    if (iVar10 < 1) goto LAB_0026efbb;
  }
  uVar6 = (pIVar16->data).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  uVar13 = (ulong)uVar6;
  if (uVar13 != 0) {
    *(uint *)(this + 8) = uVar6;
    if ((int)uVar6 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    uVar14 = uVar13 + 1;
    lVar15 = uVar13 * 0x3c;
    do {
      pNVar8 = (pIVar16->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar12 = (cpp_dec_float<50U,_int,_void> *)((long)&pNVar8[-1].val.m_backend.data + lVar15);
      *(undefined4 *)(*(long *)(this + 0x10) + -8 + uVar14 * 4) =
           *(undefined4 *)((long)(&pNVar8[-1].val + 1) + lVar15);
      local_e8.fpclass = cpp_dec_float_finite;
      local_e8.prec_elem = 10;
      local_e8.data._M_elems[0] = 0;
      local_e8.data._M_elems[1] = 0;
      local_e8.data._M_elems[2] = 0;
      local_e8.data._M_elems[3] = 0;
      local_e8.data._M_elems[4] = 0;
      local_e8.data._M_elems[5] = 0;
      local_e8.data._M_elems._24_5_ = 0;
      local_e8.data._M_elems[7]._1_3_ = 0;
      local_e8.data._M_elems._32_5_ = 0;
      local_e8.data._M_elems[9]._1_3_ = 0;
      local_e8.exp = 0;
      local_e8.neg = false;
      v = &local_a8;
      if (pcVar12 != &local_e8) {
        local_e8.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_a8.data._M_elems[4];
        local_e8.data._M_elems[5] = local_a8.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
        local_e8.data._M_elems[0] = local_a8.data._M_elems[0];
        local_e8.data._M_elems[1] = local_a8.data._M_elems[1];
        local_e8.data._M_elems[2] = local_a8.data._M_elems[2];
        local_e8.data._M_elems[3] = local_a8.data._M_elems[3];
        local_e8.exp = local_a8.exp;
        local_e8.neg = local_a8.neg;
        local_e8.prec_elem = local_a8.prec_elem;
        local_e8.fpclass = local_a8.fpclass;
        v = pcVar12;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_e8,v);
      lVar9 = *(long *)(this + 0x20);
      lVar11 = (long)(int)pcVar12[1].data._M_elems[0] * 0x38;
      *(ulong *)(lVar9 + 0x20 + lVar11) =
           CONCAT35(local_e8.data._M_elems[9]._1_3_,local_e8.data._M_elems._32_5_);
      puVar1 = (uint *)(lVar9 + 0x10 + lVar11);
      *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_e8.data._M_elems[7]._1_3_,local_e8.data._M_elems._24_5_);
      *(undefined8 *)(lVar9 + lVar11) = local_e8.data._M_elems._0_8_;
      *(undefined8 *)((uint *)(lVar9 + lVar11) + 2) = local_e8.data._M_elems._8_8_;
      *(int *)(lVar9 + 0x28 + lVar11) = local_e8.exp;
      *(bool *)(lVar9 + 0x2c + lVar11) = local_e8.neg;
      *(undefined8 *)(lVar9 + 0x30 + lVar11) = local_e8._48_8_;
      uVar14 = uVar14 - 1;
      lVar15 = lVar15 + -0x3c;
    } while (1 < uVar14);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
LAB_0026efbb:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}